

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::
str<kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::String,kj::String,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,Type *params,char **params_1,StringPtr *params_2,
          char **params_3,String *params_4,String *params_5,char (*params_6) [2])

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  ArrayPtr<const_char> *in_stack_ffffffffffffff58;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  StringPtr local_70;
  char *local_60;
  long local_58;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  pcVar1 = operator*::TYPE_STRINGS[*(uint *)this];
  sVar3 = strlen(pcVar1);
  local_58 = sVar3 + 1;
  pcVar2 = *(char **)params;
  local_60 = pcVar1;
  local_70.content.size_ = strlen(pcVar2);
  local_80.ptr = *params_1;
  local_80.size_ = (size_t)(params_1[1] + -1);
  pcVar1 = (params_2->content).ptr;
  local_70.content.ptr = pcVar2;
  local_90.size_ = strlen(pcVar1);
  pcVar2 = params_3[1];
  local_a0.ptr = pcVar2;
  if (pcVar2 != (char *)0x0) {
    local_a0.ptr = *params_3;
  }
  local_a0.size_ = (size_t)(pcVar2 + -1);
  if (pcVar2 == (char *)0x0) {
    local_a0.size_ = (size_t)(char *)0x0;
  }
  pcVar2 = (char *)(params_4->content).size_;
  local_40.ptr = pcVar2;
  if (pcVar2 != (char *)0x0) {
    local_40.ptr = (params_4->content).ptr;
  }
  local_40.size_ = (size_t)(pcVar2 + -1);
  if (pcVar2 == (char *)0x0) {
    local_40.size_ = (size_t)(char *)0x0;
  }
  local_90.ptr = pcVar1;
  local_50.size_ = strlen((char *)params_5);
  local_50.ptr = (char *)params_5;
  _::
  concat<kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_60,&local_70,&local_80,&local_90,&local_a0,&local_40
             ,&local_50,in_stack_ffffffffffffff58);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}